

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PopStyleVar(int count)

{
  ImGuiStyleMod *pIVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  pIVar2 = GImGui;
  if (0 < count) {
    uVar3 = (GImGui->StyleModifiers).Size;
    iVar4 = count + 1;
    do {
      if ((int)uVar3 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                      ,0x4ca,"value_type &ImVector<ImGuiStyleMod>::back() [T = ImGuiStyleMod]");
      }
      pIVar1 = (pIVar2->StyleModifiers).Data;
      uVar5 = (ulong)(uint)pIVar1[(ulong)uVar3 - 1].VarIdx;
      if (0x14 < uVar5) {
        __assert_fail("idx >= 0 && idx < ImGuiStyleVar_COUNT",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                      ,0x1a90,"const ImGuiStyleVarInfo *GetStyleVarInfo(ImGuiStyleVar)");
      }
      uVar6 = (ulong)GStyleVarInfo[uVar5].Offset;
      if (GStyleVarInfo[uVar5].Count == 2) {
        *(int *)((long)&(pIVar2->Style).Alpha + uVar6) =
             pIVar1[(ulong)uVar3 - 1].field_1.BackupInt[0];
        *(int *)((long)&(pIVar2->Style).WindowPadding.x + uVar6) =
             pIVar1[(ulong)uVar3 - 1].field_1.BackupInt[1];
      }
      else if (GStyleVarInfo[uVar5].Count == 1) {
        *(int *)((long)&(pIVar2->Style).Alpha + uVar6) =
             pIVar1[(ulong)uVar3 - 1].field_1.BackupInt[0];
      }
      uVar3 = uVar3 - 1;
      (pIVar2->StyleModifiers).Size = uVar3;
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  return;
}

Assistant:

void ImGui::PopStyleVar(int count)
{
    ImGuiContext& g = *GImGui;
    while (count > 0)
    {
        // We avoid a generic memcpy(data, &backup.Backup.., GDataTypeSize[info->Type] * info->Count), the overhead in Debug is not worth it.
        ImGuiStyleMod& backup = g.StyleModifiers.back();
        const ImGuiStyleVarInfo* info = GetStyleVarInfo(backup.VarIdx);
        void* data = info->GetVarPtr(&g.Style);
        if (info->Type == ImGuiDataType_Float && info->Count == 1)      { ((float*)data)[0] = backup.BackupFloat[0]; }
        else if (info->Type == ImGuiDataType_Float && info->Count == 2) { ((float*)data)[0] = backup.BackupFloat[0]; ((float*)data)[1] = backup.BackupFloat[1]; }
        g.StyleModifiers.pop_back();
        count--;
    }
}